

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GridDataType1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType1 *this)

{
  bool bVar1;
  ostream *poVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_1e0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GridDataType1 *local_18;
  GridDataType1 *this_local;
  
  local_18 = this;
  this_local = (GridDataType1 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  GridData::GetAsString_abi_cxx11_(&local_1c0,&this->super_GridData);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"GridDataType1:");
  poVar2 = std::operator<<(poVar2,"\n\tField Scale:      ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)&(this->super_GridData).field_0xc);
  poVar2 = std::operator<<(poVar2,"\n\tField Offset:     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32FieldOffset);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Values: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumValues);
  std::operator<<(poVar2,"\n\tValues: ");
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                      (&this->m_vui16Values);
  local_1e0._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vui16Values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1e0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190," ");
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEnd);
    std::ostream::operator<<(poVar2,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEnd);
  }
  std::operator<<(local_190,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType1::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType1:"
       << "\n\tField Scale:      " << m_f32FieldScale
       << "\n\tField Offset:     " << m_f32FieldOffset
       << "\n\tNumber Of Values: " << m_ui16NumValues
       << "\n\tValues: ";

    vector<KUINT16>::const_iterator citr = m_vui16Values.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vui16Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << *citr;
    }
    ss << "\n";

    return ss.str();
}